

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O2

uint __thiscall
Assimp::SpatialSort::GenerateMappingTable
          (SpatialSort *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *fill,
          ai_real pRadius)

{
  float *pfVar1;
  uint *puVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer puVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  aiVector3t<float> aVar11;
  value_type_conflict1 local_34;
  
  local_34 = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (fill,((long)(this->mPositions).
                         super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->mPositions).
                        super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x14,&local_34);
  uVar9 = 0;
  uVar7 = 0;
  do {
    pEVar3 = (this->mPositions).
             super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->mPositions).
                   super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3) / 0x14;
    if (uVar6 <= uVar9) {
      puVar5 = (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        if ((long)(fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar5 >> 2 == lVar8) {
          return uVar7;
        }
        puVar2 = puVar5 + lVar8;
        lVar8 = lVar8 + 1;
      } while (*puVar2 < uVar6);
      __assert_fail("fill[i]<mPositions.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/SpatialSort.cpp"
                    ,0x151,
                    "unsigned int Assimp::SpatialSort::GenerateMappingTable(std::vector<unsigned int> &, ai_real) const"
                   );
    }
    fVar10 = ::operator*(&pEVar3[uVar9].mPosition,&this->mPlaneNormal);
    (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start
    [(this->mPositions).
     super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
     _M_impl.super__Vector_impl_data._M_start[uVar9].mIndex] = uVar7;
    pEVar3 = (this->mPositions).
             super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar9;
    for (lVar8 = uVar9 * 0x14 + 0x24;
        (uVar9 = uVar9 + 1,
        uVar9 < (ulong)((long)(fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 2) &&
        (pEVar4 = (this->mPositions).
                  super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pfVar1 = (float *)((long)&pEVar4->mIndex + lVar8),
        *pfVar1 <= fVar10 + pRadius && fVar10 + pRadius != *pfVar1)); lVar8 = lVar8 + 0x14) {
      aVar11 = operator-((aiVector3t<float> *)((long)pEVar4 + lVar8 + -0xc),&pEVar3->mPosition);
      if (pRadius * pRadius <= aVar11.z * aVar11.z + aVar11.x * aVar11.x + aVar11.y * aVar11.y)
      break;
      (fill->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start
      [*(uint *)((long)(this->mPositions).
                       super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x10)] = uVar7;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

unsigned int SpatialSort::GenerateMappingTable(std::vector<unsigned int>& fill, ai_real pRadius) const
{
    fill.resize(mPositions.size(),UINT_MAX);
    ai_real dist, maxDist;

    unsigned int t=0;
    const ai_real pSquared = pRadius*pRadius;
    for (size_t i = 0; i < mPositions.size();) {
        dist = mPositions[i].mPosition * mPlaneNormal;
        maxDist = dist + pRadius;

        fill[mPositions[i].mIndex] = t;
        const aiVector3D& oldpos = mPositions[i].mPosition;
        for (++i; i < fill.size() && mPositions[i].mDistance < maxDist
            && (mPositions[i].mPosition - oldpos).SquareLength() < pSquared; ++i)
        {
            fill[mPositions[i].mIndex] = t;
        }
        ++t;
    }

#ifdef ASSIMP_BUILD_DEBUG

    // debug invariant: mPositions[i].mIndex values must range from 0 to mPositions.size()-1
    for (size_t i = 0; i < fill.size(); ++i) {
        ai_assert(fill[i]<mPositions.size());
    }

#endif
    return t;
}